

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O1

void __thiscall
FastPForLib::VByte::encodeToByteArray
          (VByte *this,uint32_t *in,size_t length,uint8_t *bout,size_t *nvalue)

{
  uint uVar1;
  byte *pbVar2;
  size_t sVar3;
  long lVar4;
  byte bVar5;
  
  pbVar2 = bout;
  if (length != 0) {
    sVar3 = 0;
    do {
      uVar1 = in[sVar3];
      bVar5 = (byte)uVar1;
      if (uVar1 < 0x80) {
        *pbVar2 = bVar5;
        lVar4 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar2 = bVar5 | 0x80;
        pbVar2[1] = (byte)(uVar1 >> 7);
        lVar4 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar2 = bVar5 | 0x80;
        pbVar2[1] = (byte)(uVar1 >> 7) | 0x80;
        pbVar2[2] = (byte)(uVar1 >> 0xe);
        lVar4 = 3;
      }
      else {
        *pbVar2 = bVar5 | 0x80;
        pbVar2[1] = (byte)(uVar1 >> 7) | 0x80;
        pbVar2[2] = (byte)(uVar1 >> 0xe) | 0x80;
        bVar5 = (byte)(uVar1 >> 0x15);
        if (uVar1 < 0x10000000) {
          pbVar2[3] = bVar5;
          lVar4 = 4;
        }
        else {
          pbVar2[3] = bVar5 | 0x80;
          pbVar2[4] = (byte)(uVar1 >> 0x1c);
          lVar4 = 5;
        }
      }
      pbVar2 = pbVar2 + lVar4;
      sVar3 = sVar3 + 1;
    } while (length != sVar3);
  }
  *nvalue = (long)pbVar2 - (long)bout;
  return;
}

Assistant:

void encodeToByteArray(const uint32_t *in, const size_t length, uint8_t *bout,
                         size_t &nvalue) {
    const uint8_t *const initbout = bout;
    for (size_t k = 0; k < length; ++k) {
      const uint32_t val = in[k];
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1U << 7)) {
        *bout = val & 0x7F;
        ++bout;
      } else if (val < (1U << 14)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 7);
        ++bout;
      } else if (val < (1U << 21)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 14);
        ++bout;
      } else if (val < (1U << 28)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 21);
        ++bout;
      } else {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 21) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 28);
        ++bout;
      }
    }
    nvalue = bout - initbout;
  }